

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::WireFormatTest<proto2_unittest::TestAllTypes>::SerializeReverseOrder
          (WireFormatTest<proto2_unittest::TestAllTypes> *this,TestMessageSetExtension1 *message,
          CodedOutputStream *coded_output)

{
  bool bVar1;
  byte *pbVar2;
  uint8_t *ptr;
  uint uVar3;
  undefined1 *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  ptr = coded_output->cur_;
  if ((coded_output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&coded_output->impl_,ptr);
  }
  coded_output->cur_ = ptr;
  *ptr = 'x';
  pbVar2 = ptr + 1;
  coded_output->cur_ = pbVar2;
  uVar3 = (message->field_0)._impl_.i_;
  uVar6 = (ulong)(int)uVar3;
  if ((coded_output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&coded_output->impl_,pbVar2);
  }
  coded_output->cur_ = pbVar2;
  uVar7 = uVar6;
  if (0x7f < uVar3) {
    do {
      *pbVar2 = (byte)uVar7 | 0x80;
      uVar6 = uVar7 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar6;
  pbVar2 = pbVar2 + 1;
  coded_output->cur_ = pbVar2;
  if ((coded_output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&coded_output->impl_,pbVar2);
  }
  coded_output->cur_ = pbVar2;
  pbVar2[0] = 0x82;
  pbVar2[1] = 1;
  pbVar2 = pbVar2 + 2;
  coded_output->cur_ = pbVar2;
  puVar4 = (undefined1 *)(message->field_0)._impl_.recursive_;
  if ((TestMessageSet *)puVar4 == (TestMessageSet *)0x0) {
    puVar4 = proto2_wireformat_unittest::_TestMessageSet_default_instance_;
  }
  uVar3 = *(uint *)((long)&((TestMessageSet *)puVar4)->field_0 + 0x18);
  if ((coded_output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&coded_output->impl_,pbVar2);
  }
  coded_output->cur_ = pbVar2;
  uVar5 = uVar3;
  if (0x7f < uVar3) {
    do {
      *pbVar2 = (byte)uVar5 | 0x80;
      uVar3 = uVar5 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  coded_output->cur_ = pbVar2 + 1;
  puVar4 = (undefined1 *)(message->field_0)._impl_.recursive_;
  if ((TestMessageSet *)puVar4 == (TestMessageSet *)0x0) {
    puVar4 = proto2_wireformat_unittest::_TestMessageSet_default_instance_;
  }
  SerializeReverseOrder(this,(TestMessageSet *)puVar4,coded_output);
  return;
}

Assistant:

void SerializeReverseOrder(const TestMessageSetExtension1& message,
                             io::CodedOutputStream* coded_output) {
    WireFormatLite::WriteTag(15,  // i
                             WireFormatLite::WIRETYPE_VARINT, coded_output);
    coded_output->WriteVarint64(message.i());
    WireFormatLite::WriteTag(16,  // recursive
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                             coded_output);
    coded_output->WriteVarint32(message.recursive().GetCachedSize());
    SerializeReverseOrder(message.recursive(), coded_output);
  }